

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O3

void cmdline_cleanup(void)

{
  char *b;
  size_t n;
  
  b = cmdline_password;
  if (cmdline_password != (char *)0x0) {
    n = strlen(cmdline_password);
    smemclr(b,n);
    safefree(cmdline_password);
    cmdline_password = (char *)0x0;
  }
  safefree(saves[0].params);
  saves[0].savesize = 0;
  saves[0].params = (cmdline_saved_param *)0x0;
  saves[0].nsaved = 0;
  safefree(saves[1].params);
  saves[1].savesize = 0;
  saves[1].params = (cmdline_saved_param *)0x0;
  saves[1].nsaved = 0;
  return;
}

Assistant:

void cmdline_cleanup(void)
{
    int pri;

    if (cmdline_password) {
        smemclr(cmdline_password, strlen(cmdline_password));
        sfree(cmdline_password);
        cmdline_password = NULL;
    }

    for (pri = 0; pri < NPRIORITIES; pri++) {
        sfree(saves[pri].params);
        saves[pri].params = NULL;
        saves[pri].savesize = 0;
        saves[pri].nsaved = 0;
    }
}